

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O0

CSipHasher * __thiscall CSipHasher::Write(CSipHasher *this,Span<const_unsigned_char> data)

{
  long lVar1;
  size_t sVar2;
  byte *pbVar3;
  ulong offset;
  _If_is_unsigned_integer<unsigned_long> _Var4;
  _If_is_unsigned_integer<unsigned_long> _Var5;
  ulong uVar6;
  _If_is_unsigned_integer<unsigned_long> _Var7;
  ulong uVar8;
  _If_is_unsigned_integer<unsigned_long> _Var9;
  _If_is_unsigned_integer<unsigned_long> _Var10;
  _If_is_unsigned_integer<unsigned_long> _Var11;
  ulong uVar12;
  ulong uVar13;
  CSipHasher *in_RDI;
  long in_FS_OFFSET;
  uint8_t c;
  uint64_t t;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  byte local_59;
  ulong local_58;
  ulong local_50;
  _If_is_unsigned_integer<unsigned_long> local_48;
  ulong local_40;
  ulong local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = in_RDI->v[0];
  local_40 = in_RDI->v[1];
  local_48 = in_RDI->v[2];
  local_50 = in_RDI->v[3];
  local_58 = in_RDI->tmp;
  local_59 = in_RDI->count;
  while( true ) {
    sVar2 = Span<const_unsigned_char>::size(in_stack_ffffffffffffff88);
    if (sVar2 == 0) break;
    pbVar3 = Span<const_unsigned_char>::front(in_stack_ffffffffffffff88);
    offset = (ulong)*pbVar3;
    local_58 = offset << (sbyte)((uint)local_59 % 8 << 3) | local_58;
    local_59 = local_59 + 1;
    if ((local_59 & 7) == 0) {
      _Var4 = std::rotl<unsigned_long>((unsigned_long)in_RDI,0);
      _Var5 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      uVar6 = (local_58 ^ local_50) + local_48;
      _Var7 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      uVar8 = (uVar6 ^ _Var7) + _Var5;
      _Var5 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      _Var7 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      _Var9 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      _Var10 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      _Var11 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      uVar12 = (uVar8 ^ _Var5) + _Var9;
      _Var5 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      uVar13 = (uVar12 ^ _Var5) + _Var11;
      _Var5 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      local_50 = uVar13 ^ _Var5;
      _Var5 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      local_40 = (((local_40 + local_38 ^ _Var4) + uVar6 ^ _Var7) + uVar8 ^ _Var10) + uVar12 ^ _Var5
      ;
      local_48 = std::rotl<unsigned_long>((unsigned_long)in_RDI,(int)(offset >> 0x20));
      local_38 = local_58 ^ uVar13;
      local_58 = 0;
    }
    Span<const_unsigned_char>::subspan((Span<const_unsigned_char> *)in_RDI,offset);
  }
  in_RDI->v[0] = local_38;
  in_RDI->v[1] = local_40;
  in_RDI->v[2] = local_48;
  in_RDI->v[3] = local_50;
  in_RDI->count = local_59;
  in_RDI->tmp = local_58;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CSipHasher& CSipHasher::Write(Span<const unsigned char> data)
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];
    uint64_t t = tmp;
    uint8_t c = count;

    while (data.size() > 0) {
        t |= uint64_t{data.front()} << (8 * (c % 8));
        c++;
        if ((c & 7) == 0) {
            v3 ^= t;
            SIPROUND;
            SIPROUND;
            v0 ^= t;
            t = 0;
        }
        data = data.subspan(1);
    }

    v[0] = v0;
    v[1] = v1;
    v[2] = v2;
    v[3] = v3;
    count = c;
    tmp = t;

    return *this;
}